

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * ON_Font::DefaultEngravingFont(void)

{
  if (DefaultEngravingFont::default_engraving_font != (ON_Font *)0x0) {
    return DefaultEngravingFont::default_engraving_font;
  }
  ON_ManagedFonts::InstalledFonts();
  DefaultEngravingFont::default_engraving_font =
       ON_FontList::Internal_FromNames
                 (&ON_ManagedFonts::List.m_installed_fonts,L"SLFRHNArchitect-Regular",
                  L"SLF-RHN Architect",L"SLF-RHN Architect",L"Regular",Normal,Medium,Upright,false,
                  false,true,false,false,0.0);
  return DefaultEngravingFont::default_engraving_font;
}

Assistant:

const ON_Font* ON_Font::DefaultEngravingFont()
{
  // The PostScript name works on Widows and is the best way on Apple.
  /*
   Font description = "SLF-RHN Architect Regular"
      Family name = "SLF-RHN Architect"
      Face name = "Regular"
      PostScript name = "SLFRHNArchitect-Regular"
      Quartet = SLF-RHN Architect (Regular)
      Windows LOGFONT name = "SLF-RHN Architect"
      Rich text name = "SLF-RHN Architect"
      Origin = Windows Font
      Outline type = Engraving - single stroke
      PointSize = annotation default
      Quartet: SLF-RHN Architect (Regular member)
      Weight = Normal
      Stretch = Medium
      Style = Upright
      Underlined = false
      Strikethrough = false
      Symbol font = false
      Engraving font = Single-stroke
      Font characteristics SHA-1 hash = E5527949C70756BFBC586AB04A9CFAD9FB5D9038
      LOGFONT
  */
  static const ON_Font* default_engraving_font = nullptr;

  if (nullptr == default_engraving_font)
  {
    default_engraving_font = ON_Font::InstalledFontList().FromNames(
      L"SLFRHNArchitect-Regular", // postscript_name,
      L"SLF-RHN Architect", // windows_logfont_name,
      L"SLF-RHN Architect", // family_name,
      L"Regular", // prefered_face_name,
      ON_Font::Weight::Normal,  // prefered_weight,
      ON_Font::Stretch::Medium, // prefered_stretch,
      ON_Font::Style::Upright,   // prefered_style,
      false, // bRequireFaceMatch,
      false, // bRequireStyleMatch,
      false, // bUnderlined,
      false, // bStrikethrough,
      0.0 // point_size
    );
  }

  return default_engraving_font;
}